

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

double __thiscall
despot::RockSampleParticleUpperBound2::Value(RockSampleParticleUpperBound2 *this,State *state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  double dVar6;
  int local_2c;
  double dStack_28;
  int rock;
  double value;
  RockSampleState *rockstate;
  State *state_local;
  RockSampleParticleUpperBound2 *this_local;
  
  dStack_28 = 0.0;
  for (local_2c = 0; local_2c < this->rs_model_->num_rocks_; local_2c = local_2c + 1) {
    bVar1 = BaseRockSample::GetRock(this->rs_model_,state,local_2c);
    uVar4 = BaseRockSample::GetRobPos(this->rs_model_,state);
    pvVar5 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&this->rs_model_->rock_pos_,(long)local_2c);
    iVar2 = despot::Coord::ManhattanDistance(uVar4,*(undefined8 *)pvVar5);
    dVar6 = Globals::Discount(iVar2);
    dStack_28 = (double)bVar1 * 10.0 * dVar6 + dStack_28;
  }
  iVar2 = this->rs_model_->size_;
  iVar3 = BaseRockSample::GetX(this->rs_model_,state);
  dVar6 = Globals::Discount(iVar2 - iVar3);
  return dVar6 * 10.0 + dStack_28;
}

Assistant:

double Value(const State& state) const {
		const RockSampleState& rockstate =
			static_cast<const RockSampleState&>(state);
		double value = 0;
		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			value += 10.0 * rs_model_->GetRock(&rockstate, rock)
				* Globals::Discount(
					Coord::ManhattanDistance(rs_model_->GetRobPos(&rockstate),
						rs_model_->rock_pos_[rock]));
		value += 10.0
			* Globals::Discount(rs_model_->size_ - rs_model_->GetX(&rockstate));
		return value;
	}